

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O0

ChannelList * Imf_3_4::channelsInNoView(ChannelList *channelList,StringVector *multiView)

{
  ChannelList *in_RDI;
  StringVector *in_stack_00000048;
  allocator<char> local_39;
  string local_38 [8];
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  channelsInView((string *)channelList,(ChannelList *)multiView,in_stack_00000048);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  return in_RDI;
}

Assistant:

ChannelList
channelsInNoView (const ChannelList& channelList, const StringVector& multiView)
{
    //
    // Return a list of channels not associated with any named view.
    //

    return channelsInView ("", channelList, multiView);
}